

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall Units_hasUnitsName_Test::TestBody(Units_hasUnitsName_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  char *pcVar5;
  AssertionResult local_128 [2];
  AssertHelper local_108 [8];
  Message local_100 [15];
  allocator<char> local_f1;
  string local_f0 [39];
  bool local_c9;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_;
  string local_b0 [39];
  allocator<char> local_89;
  string local_88 [55];
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  UnitsPtr u;
  ModelPtr m;
  Units_hasUnitsName_Test *this_local;
  
  libcellml::Model::create();
  libcellml::Units::create();
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"a_unit",&local_51);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,"micro",&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b0,"",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::Units::addUnit((StandardUnit)peVar3,(string *)0x0,1.0,1.0,local_88);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::Model::addUnits((shared_ptr *)peVar4);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"a_unit",&local_f1);
  bVar1 = libcellml::Model::hasUnits((string *)peVar4);
  local_c9 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c8,&local_c9,(type *)0x0)
  ;
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar2) {
    testing::Message::Message(local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_128,local_c8,"m->hasUnits(\"a_unit\")","false");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x107,pcVar5);
    testing::internal::AssertHelper::operator=(local_108,local_100);
    testing::internal::AssertHelper::~AssertHelper(local_108);
    std::__cxx11::string::~string((string *)local_128);
    testing::Message::~Message(local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_30);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, hasUnitsName)
{
    libcellml::ModelPtr m = libcellml::Model::create();

    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("a_unit");

    u->addUnit(libcellml::Units::StandardUnit::AMPERE, "micro");
    m->addUnits(u);
    EXPECT_TRUE(m->hasUnits("a_unit"));
}